

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_34a75b::CCoinsViewTest::GetCoin
          (CCoinsViewTest *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  bool bVar2;
  Coin *in_RDX;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  find(in_RDI,(key_type *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  end(in_RDI);
  bVar2 = std::operator==((_Self *)in_RDX,(_Self *)in_RDI);
  if (bVar2) {
    local_19 = false;
  }
  else {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_Coin>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_Coin>_> *)
               CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    Coin::operator=(in_RDX,(Coin *)in_RDI);
    bVar2 = Coin::IsSpent((Coin *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if ((!bVar2) ||
       (bVar2 = RandomMixin<FastRandomContext>::randbool
                          ((RandomMixin<FastRandomContext> *)
                           CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)), bVar2)) {
      local_19 = true;
    }
    else {
      local_19 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

[[nodiscard]] bool GetCoin(const COutPoint& outpoint, Coin& coin) const override
    {
        std::map<COutPoint, Coin>::const_iterator it = map_.find(outpoint);
        if (it == map_.end()) {
            return false;
        }
        coin = it->second;
        if (coin.IsSpent() && m_rng.randbool() == 0) {
            // Randomly return false in case of an empty entry.
            return false;
        }
        return true;
    }